

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

bool __thiscall QFSFileEnginePrivate::closeFdFh(QFSFileEnginePrivate *this)

{
  long lVar1;
  int iVar2;
  QFSFileEngine *pQVar3;
  byte bVar4;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  int ret;
  bool closed;
  bool flushed;
  QFSFileEngine *q;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  FileError error;
  undefined6 in_stack_ffffffffffffffb0;
  byte in_stack_ffffffffffffffb6;
  byte bVar6;
  int local_40;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  if ((in_RDI->fd == -1) && (in_RDI->fh == (FILE *)0x0)) {
    local_21 = false;
  }
  else {
    bVar6 = 1;
    if ((in_RDI->fh != (FILE *)0x0) &&
       (in_stack_ffffffffffffffb6 = 0, bVar6 = in_stack_ffffffffffffffb6,
       (in_RDI->lastFlushFailed & 1U) == 0)) {
      iVar2 = (*(pQVar3->super_QAbstractFileEngine)._vptr_QAbstractFileEngine[4])();
      in_stack_ffffffffffffffb6 = (byte)iVar2;
      bVar6 = in_stack_ffffffffffffffb6;
    }
    bVar4 = bVar6 & 1;
    bVar5 = true;
    in_RDI->field_0xc2 = in_RDI->field_0xc2 & 0xfb;
    if ((in_RDI->closeFileHandle & 1U) != 0) {
      if (in_RDI->fh == (FILE *)0x0) {
        local_40 = qt_safe_close(in_stack_ffffffffffffffa4);
      }
      else {
        local_40 = fclose((FILE *)in_RDI->fh);
      }
      in_RDI->fh = (FILE *)0x0;
      in_RDI->fd = -1;
      bVar5 = local_40 == 0;
    }
    if ((bVar4 == 0) || (!bVar5)) {
      if (bVar4 != 0) {
        __errno_location();
        error = (FileError)((ulong)pQVar3 >> 0x20);
        QSystemError::stdString(error);
        QAbstractFileEngine::setError
                  ((QAbstractFileEngine *)
                   CONCAT17(bVar6,CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                   error,(QString *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        QString::~QString((QString *)0x12ad91);
      }
      local_21 = false;
    }
    else {
      local_21 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool QFSFileEnginePrivate::closeFdFh()
{
    Q_Q(QFSFileEngine);
    if (fd == -1 && !fh)
        return false;

    // Flush the file if it's buffered, and if the last flush didn't fail.
    bool flushed = !fh || (!lastFlushFailed && q->flush());
    bool closed = true;
    tried_stat = 0;

    // Close the file if we created the handle.
    if (closeFileHandle) {
        int ret;

        if (fh) {
            // Close buffered file.
            ret = fclose(fh);
        } else {
            // Close unbuffered file.
            ret = QT_CLOSE(fd);
        }

        // We must reset these guys regardless; calling close again after a
        // failed close causes crashes on some systems.
        fh = nullptr;
        fd = -1;
        closed = (ret == 0);
    }

    // Report errors.
    if (!flushed || !closed) {
        if (flushed) {
            // If not flushed, we want the flush error to fall through.
            q->setError(QFile::UnspecifiedError, QSystemError::stdString(errno));
        }
        return false;
    }

    return true;
}